

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoCall(Thread *this,Ptr *func,Ptr *out_trap)

{
  RunResult RVar1;
  Result result;
  Func *pFVar2;
  HostFunc *func_00;
  size_type __n;
  DefinedFunc *func_01;
  allocator<wabt::interp::Value> local_71;
  undefined1 local_70 [8];
  Values results;
  undefined1 local_50 [8];
  Values params;
  FuncType *func_type;
  HostFunc *host_func;
  Ptr *out_trap_local;
  Ptr *func_local;
  Thread *this_local;
  
  pFVar2 = RefPtr<wabt::interp::Func>::get(func);
  func_00 = dyn_cast<wabt::interp::HostFunc,wabt::interp::Func>(pFVar2);
  if (func_00 == (HostFunc *)0x0) {
    pFVar2 = RefPtr<wabt::interp::Func>::get(func);
    func_01 = cast<wabt::interp::DefinedFunc,wabt::interp::Func>(pFVar2);
    RVar1 = PushCall(this,func_01,out_trap);
    if (RVar1 == Trap) {
      return Ok;
    }
  }
  else {
    params.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)Func::type(&func_00->super_Func);
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
              ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_50);
    PopValues(this,(ValueTypes *)
                   (params.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1),(Values *)local_50);
    RVar1 = PushCall(this,func_00,out_trap);
    if (RVar1 == Trap) {
      this_local._4_4_ = Trap;
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      __n = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                       ((long)&params.
                               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[2].field_0 + 8));
      std::allocator<wabt::interp::Value>::allocator(&local_71);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_70,__n,
                 &local_71);
      std::allocator<wabt::interp::Value>::~allocator(&local_71);
      result = Func::Call(&func_00->super_Func,this,(Values *)local_50,(Values *)local_70,out_trap);
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = Failed(result);
      if (results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_) {
        this_local._4_4_ = Trap;
      }
      else {
        PopCall(this);
        PushValues(this,(ValueTypes *)
                        ((long)&params.
                                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[2].field_0 + 8),
                   (Values *)local_70);
      }
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_70);
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
              ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_50);
    if (results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
      return this_local._4_4_;
    }
  }
  return Ok;
}

Assistant:

RunResult Thread::DoCall(const Func::Ptr& func, Trap::Ptr* out_trap) {
  if (auto* host_func = dyn_cast<HostFunc>(func.get())) {
    auto& func_type = host_func->type();

    Values params;
    PopValues(func_type.params, &params);
    if (PushCall(*host_func, out_trap) == RunResult::Trap) {
      return RunResult::Trap;
    }

    Values results(func_type.results.size());
    if (Failed(host_func->Call(*this, params, results, out_trap))) {
      return RunResult::Trap;
    }

    PopCall();
    PushValues(func_type.results, results);
  } else {
    if (PushCall(*cast<DefinedFunc>(func.get()), out_trap) == RunResult::Trap) {
      return RunResult::Ok;
    }
  }
  return RunResult::Ok;
}